

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua_sjasm.cpp
# Opt level: O0

bool isInlinedScript(TextFilePos *errorPos,char *script_name)

{
  uint32_t uVar1;
  int iVar2;
  char *pcVar3;
  size_type sVar4;
  reference pvVar5;
  int scriptNumber;
  char *script_name_local;
  TextFilePos *errorPos_local;
  
  pcVar3 = strstr(script_name,"[string \"script ");
  if (((script_name == pcVar3) && (iVar2 = atoi(script_name + 0x10), -1 < iVar2)) &&
     (sVar4 = std::vector<TextFilePos,_std::allocator<TextFilePos>_>::size(&scripts_origin),
     iVar2 < (int)sVar4)) {
    pvVar5 = std::vector<TextFilePos,_std::allocator<TextFilePos>_>::at(&scripts_origin,(long)iVar2)
    ;
    errorPos->filename = pvVar5->filename;
    uVar1 = pvVar5->colBegin;
    errorPos->line = pvVar5->line;
    errorPos->colBegin = uVar1;
    errorPos->colEnd = pvVar5->colEnd;
    return true;
  }
  return false;
}

Assistant:

static bool isInlinedScript(TextFilePos & errorPos, const char* script_name) {
	// return false when the script is external (real file name)
	if (script_name != strstr(script_name, "[string \"script ")) return false;
	// inlined script, find it's origin and add line number to that
	int scriptNumber = atoi(script_name + 16);
	if (scriptNumber < 0 || int(scripts_origin.size()) <= scriptNumber) return false;
	errorPos = scripts_origin.at(scriptNumber);
	return true;
}